

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = num_docs();
  printf("-- speed tests determine parsing throughput given %d different sample documents --\n",
         (ulong)uVar1);
  puts("With UTF8 validation:");
  iVar2 = run(1);
  if (iVar2 != 0) {
    return iVar2;
  }
  puts("Without UTF8 validation:");
  iVar2 = run(0);
  return iVar2;
}

Assistant:

int
main(void)
{
    int rv = 0;

    printf("-- speed tests determine parsing throughput given %d different sample documents --\n",
           num_docs());

    printf("With UTF8 validation:\n");
    rv = run(1);
    if (rv != 0) return rv;
    printf("Without UTF8 validation:\n");
    rv = run(0);
    return rv;
}